

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O3

void __thiscall TCLAP::CmdLine::xorAdd(CmdLine *this,Arg *a,Arg *b)

{
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> ors;
  Arg *local_30;
  void *local_28;
  iterator iStack_20;
  Arg **local_18;
  
  local_28 = (void *)0x0;
  iStack_20._M_current = (Arg **)0x0;
  local_18 = (Arg **)0x0;
  local_30 = a;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_28,(iterator)0x0,&local_30);
  local_30 = b;
  if (iStack_20._M_current == local_18) {
    std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
              ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_28,iStack_20,&local_30);
  }
  else {
    *iStack_20._M_current = b;
    iStack_20._M_current = iStack_20._M_current + 1;
  }
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[5])(this,&local_28);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28);
  }
  return;
}

Assistant:

inline void CmdLine::xorAdd( Arg& a, Arg& b )
{
	std::vector<Arg*> ors;
	ors.push_back( &a );
	ors.push_back( &b );
	xorAdd( ors );
}